

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendFuncCase::init(BlendFuncCase *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  string local_38;
  
  context = (this->super_TestCase).m_context;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"GL_EXT_draw_buffers_indexed","");
  isExtensionSupported(context,&local_38);
  iVar1 = extraout_EAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void BlendFuncCase::init (void)
{
	isExtensionSupported(m_context, "GL_EXT_draw_buffers_indexed");
}